

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O1

QRect __thiscall
QtMWidgets::SliderPrivate::grooveHighlightedRect(SliderPrivate *this,QRect *sh,QRect *gr)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QRect QVar6;
  
  cVar1 = QAbstractSlider::invertedAppearance();
  iVar2 = QAbstractSlider::orientation();
  if (cVar1 == '\0') {
    if (iVar2 == 2) {
      iVar4 = ~gr->y2 + gr->y1 + sh->y1 + this->radius;
      iVar2 = 0;
    }
    else {
      iVar2 = ~gr->x2 + gr->x1 + sh->x1 + this->radius;
      iVar4 = 0;
    }
    iVar3 = gr->x1;
    iVar5 = gr->y1;
    iVar2 = iVar2 + gr->x2;
    iVar4 = iVar4 + gr->y2;
  }
  else {
    if (iVar2 == 2) {
      iVar5 = this->radius + sh->y1;
      iVar3 = 0;
    }
    else {
      iVar3 = this->radius + sh->x1;
      iVar5 = 0;
    }
    iVar3 = iVar3 + gr->x1;
    iVar5 = iVar5 + gr->y1;
    iVar2 = gr->x2;
    iVar4 = gr->y2;
  }
  QVar6.y1 = iVar5;
  QVar6.x1 = iVar3;
  QVar6.y2 = iVar4;
  QVar6.x2 = iVar2;
  return QVar6;
}

Assistant:

QRect
SliderPrivate::grooveHighlightedRect( const QRect & sh, const QRect & gr ) const
{
	int grhw = 0, grhh = 0;

	QRect grh;

	if( !q->invertedAppearance() )
	{
		if( q->orientation() == Qt::Vertical )
			grhh = gr.height() - sh.y() - radius;
		else
			grhw = gr.width() - sh.x() - radius;

		grh = gr.marginsRemoved( QMargins( 0, 0, grhw, grhh ) );
	}
	else
	{
		if( q->orientation() == Qt::Vertical )
			grhh = sh.y() + radius;
		else
			grhw = sh.x() + radius;

		grh = gr.marginsRemoved( QMargins( grhw, grhh, 0, 0 ) );
	}

	return grh;
}